

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v7::detail::bigint::assign_pow10(bigint *this,int exp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if (exp < 0) {
    __assert_fail("exp >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x576,"void fmt::detail::bigint::assign_pow10(int)");
  }
  if (exp != 0) {
    uVar3 = 1;
    do {
      uVar2 = uVar3;
      uVar3 = uVar2 * 2;
    } while ((int)uVar2 <= exp);
    assign(this,5);
    if (3 < uVar2) {
      uVar3 = uVar2 >> 2;
      do {
        square(this);
        if ((uVar3 & exp) != 0) {
          multiply(this,5);
        }
        bVar1 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar1);
    }
    operator<<=(this,exp);
    return;
  }
  assign(this,1);
  return;
}

Assistant:

void assign_pow10(int exp) {
    assert(exp >= 0);
    if (exp == 0) return assign(1);
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    assign(5);
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }